

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_MinPlayers.cpp
# Opt level: O1

void __thiscall
RenX_MinPlayersPlugin::AnyDeath(RenX_MinPlayersPlugin *this,Server *server,PlayerInfo *player)

{
  Server *pSVar1;
  ulong uVar2;
  ulong uVar3;
  Server *pSVar4;
  
  if (((this->phase_bots != 0) && (player->isBot == true)) && (*(long *)(server + 0x20) != 0)) {
    pSVar1 = server + 0x10;
    pSVar4 = *(Server **)pSVar1;
    if (pSVar4 == pSVar1) {
      uVar3 = 0;
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      uVar3 = 0;
      do {
        if (*(int *)(pSVar4 + 0x108) == 1) {
          uVar3 = uVar3 + 1;
        }
        else if (*(int *)(pSVar4 + 0x108) == 0) {
          uVar2 = uVar2 + 1;
        }
        pSVar4 = *(Server **)pSVar4;
      } while (pSVar4 != pSVar1);
    }
    if (uVar3 < uVar2) {
      if (player->team == Nod) {
        return;
      }
    }
    else if ((uVar2 < uVar3) && (player->team == GDI)) {
      return;
    }
    RenX::Server::kickPlayer(server,player,0xb,"Bot Phasing");
    this->phase_bots = this->phase_bots - 1;
  }
  return;
}

Assistant:

void RenX_MinPlayersPlugin::AnyDeath(RenX::Server &server, const RenX::PlayerInfo &player) {
	if (RenX_MinPlayersPlugin::phase_bots != 0 && player.isBot && server.players.size() != 0) {
		size_t gdi_count = 0, nod_count = 0;
		for (auto node = server.players.begin(); node != server.players.end(); ++node) {
			switch (node->team) {
			case RenX::TeamType::GDI:
				++gdi_count;
				break;
			case RenX::TeamType::Nod:
				++nod_count;
				break;
			default:
				break;
			}
		}

		if (gdi_count > nod_count) {
			if (player.team != RenX::TeamType::Nod) {
				server.kickPlayer(player, "Bot Phasing"sv);
				--RenX_MinPlayersPlugin::phase_bots;
			}
		}
		else if (nod_count > gdi_count) {
			if (player.team != RenX::TeamType::GDI) {
				server.kickPlayer(player, "Bot Phasing"sv);
				--RenX_MinPlayersPlugin::phase_bots;
			}
		}
		else {
			server.kickPlayer(player, "Bot Phasing"sv);
			--RenX_MinPlayersPlugin::phase_bots;
		}
	}
}